

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InterfacePortHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InterfacePortHeaderSyntax,slang::parsing::Token&,slang::syntax::DotMemberClauseSyntax*&>
          (BumpAllocator *this,Token *args,DotMemberClauseSyntax **args_1)

{
  InterfacePortHeaderSyntax *this_00;
  BumpAllocator *in_RDX;
  Token *in_RSI;
  DotMemberClauseSyntax *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  this_00 = (InterfacePortHeaderSyntax *)
            allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  slang::syntax::InterfacePortHeaderSyntax::InterfacePortHeaderSyntax
            (this_00,*in_RSI,in_stack_ffffffffffffffc8);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }